

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void change_waveform(OPL_DATA_conflict *chip,Bitu regbase,op_type_conflict *op_pt)

{
  op_type_conflict *op_pt_local;
  Bitu regbase_local;
  OPL_DATA_conflict *chip_local;
  
  op_pt_local._4_4_ = regbase;
  if (0xff < regbase) {
    op_pt_local._4_4_ = regbase - 0xea;
  }
  op_pt->cur_wmask = wavemask[chip->wave_sel[op_pt_local._4_4_]];
  op_pt->cur_wform = wavtable + waveform[chip->wave_sel[op_pt_local._4_4_]];
  return;
}

Assistant:

static void change_waveform(OPL_DATA* chip, Bitu regbase, op_type* op_pt)
{
#if defined(OPLTYPE_IS_OPL3)
	if (regbase>=ARC_SECONDSET) regbase -= (ARC_SECONDSET-22);	// second set starts at 22
#endif
	// waveform selection
	op_pt->cur_wmask = wavemask[chip->wave_sel[regbase]];
	op_pt->cur_wform = &wavtable[waveform[chip->wave_sel[regbase]]];
	// (might need to be adapted to waveform type here...)
}